

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

Constant * __thiscall soul::heart::Allocator::allocateConstant(Allocator *this,Value *value)

{
  Constant *pCVar1;
  CodeLocation local_18;
  
  local_18.sourceCode.object = (SourceCodeText *)0x0;
  local_18.location.data = (char *)0x0;
  pCVar1 = PoolAllocator::allocate<soul::heart::Constant,soul::CodeLocation,soul::Value>
                     (&this->pool,&local_18,value);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_18.sourceCode.object);
  return pCVar1;
}

Assistant:

Constant& allocateConstant (Value value)              { return allocate<heart::Constant> (CodeLocation(), std::move (value)); }